

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::_create(xml_document *this)

{
  uintptr_t uVar1;
  xml_memory_page *pxVar2;
  xml_document_struct *in_RDI;
  xml_memory_page *page;
  size_t page_offset;
  xml_memory_page *page_00;
  xml_allocator *local_20;
  
  pxVar2 = impl::anon_unknown_0::xml_memory_page::construct(&(in_RDI->super_xml_node_struct).value);
  pxVar2->busy_size = 0x7fd8;
  page_00 = pxVar2 + 1;
  impl::anon_unknown_0::xml_document_struct::xml_document_struct(in_RDI,page_00);
  (in_RDI->super_xml_node_struct).header = (uintptr_t)page_00;
  *(uintptr_t *)((in_RDI->super_xml_node_struct).header + 0x28) =
       (in_RDI->super_xml_node_struct).header;
  uVar1 = (in_RDI->super_xml_node_struct).header;
  local_20 = (xml_allocator *)0x0;
  if (uVar1 != 0) {
    local_20 = (xml_allocator *)(uVar1 + 0x40);
  }
  pxVar2->allocator = local_20;
  return;
}

Assistant:

PUGI_IMPL_FN void xml_document::_create()
	{
		assert(!_root);

	#ifdef PUGIXML_COMPACT
		// space for page marker for the first page (uint32_t), rounded up to pointer size; assumes pointers are at least 32-bit
		const size_t page_offset = sizeof(void*);
	#else
		const size_t page_offset = 0;
	#endif

		// initialize sentinel page
		PUGI_IMPL_STATIC_ASSERT(sizeof(impl::xml_memory_page) + sizeof(impl::xml_document_struct) + page_offset <= sizeof(_memory));

		// prepare page structure
		impl::xml_memory_page* page = impl::xml_memory_page::construct(_memory);
		assert(page);

		page->busy_size = impl::xml_memory_page_size;

		// setup first page marker
	#ifdef PUGIXML_COMPACT
		// round-trip through void* to avoid 'cast increases required alignment of target type' warning
		page->compact_page_marker = reinterpret_cast<uint32_t*>(static_cast<void*>(reinterpret_cast<char*>(page) + sizeof(impl::xml_memory_page)));
		*page->compact_page_marker = sizeof(impl::xml_memory_page);
	#endif

		// allocate new root
		_root = new (reinterpret_cast<char*>(page) + sizeof(impl::xml_memory_page) + page_offset) impl::xml_document_struct(page);
		_root->prev_sibling_c = _root;

		// setup sentinel page
		page->allocator = static_cast<impl::xml_document_struct*>(_root);

		// setup hash table pointer in allocator
	#ifdef PUGIXML_COMPACT
		page->allocator->_hash = &static_cast<impl::xml_document_struct*>(_root)->hash;
	#endif

		// verify the document allocation
		assert(reinterpret_cast<char*>(_root) + sizeof(impl::xml_document_struct) <= _memory + sizeof(_memory));
	}